

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O3

void MNS::Server::onClose(uv_handle_t *handle)

{
  SocketData *this;
  Server *pSVar1;
  SocketData *in_RAX;
  SocketData *local_18;
  
  this = (SocketData *)handle->data;
  pSVar1 = this->server;
  local_18 = in_RAX;
  if ((pSVar1 != (Server *)0x0) &&
     ((pSVar1->onHttpCancelHandler).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_18 = this;
    (*(pSVar1->onHttpCancelHandler)._M_invoker)((_Any_data *)&pSVar1->onHttpCancelHandler,&local_18)
    ;
  }
  std::
  _Hashtable<int,_std::pair<const_int,_uv_poll_s_*>,_std::allocator<std::pair<const_int,_uv_poll_s_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&polls._M_h,this);
  close(this->fd);
  SocketData::~SocketData(this);
  operator_delete(this);
  free(handle);
  return;
}

Assistant:

void MNS::Server::onClose(uv_handle_t *handle) {
	MNS::SocketData *data = static_cast<MNS::SocketData *>(handle->data);
	// Deregister NodeJS Persistent<Object>
	MNS::Server *server = data->server;
	if(server && server->onHttpCancelHandler) server->onHttpCancelHandler(data);

	polls.erase(data->fd);
	close(data->fd);
	delete (data);
	free(handle);
}